

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution>
::verifyImageData(TestStatus *__return_storage_ptr__,
                 MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution> *this,
                 VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
                 vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  float *pfVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  TestStatus *pTVar5;
  uint uVar6;
  ChannelOrder x;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float in_XMM1_Db;
  float in_XMM1_Dd;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ConstPixelBufferAccess local_e8;
  TestStatus *local_c0;
  ulong local_b8;
  Vec2 distanceFromCenter_1;
  undefined1 local_a8 [16];
  Vec2 distanceFromCenter;
  Vector<float,_2> local_70;
  TextureFormat local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  TextureFormat local_48;
  
  local_b8 = (ulong)imageMSInfo->samples;
  local_58 = (float)local_b8;
  fStack_50 = 0.0;
  fVar12 = SQRT(1.0 / (local_58 * 12.0));
  fVar12 = fVar12 + fVar12;
  uVar6 = 0;
  local_c0 = __return_storage_ptr__;
  local_68 = (TextureFormat)dataRS;
  fStack_54 = in_XMM1_Db;
  fStack_4c = in_XMM1_Dd;
  do {
    if ((imageRSInfo->extent).depth <= uVar6) {
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      for (uVar6 = 0; uVar6 < (imageMSInfo->extent).depth; uVar6 = uVar6 + 1) {
        for (uVar8 = 0; uVar8 < (imageMSInfo->extent).height; uVar8 = uVar8 + 1) {
          uVar10 = 0;
          while( true ) {
            if ((imageMSInfo->extent).width <= uVar10) break;
            std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       &distanceFromCenter,local_b8,(allocator_type *)&local_e8);
            iVar11 = 0;
            for (uVar9 = 0; local_b8 != uVar9; uVar9 = uVar9 + 1) {
              tcu::ConstPixelBufferAccess::getPixelUint
                        (&local_e8,
                         (int)(dataPerSample->
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              )._M_impl.super__Vector_impl_data._M_start + iVar11,uVar10,uVar8);
              if (local_e8.m_size.m_data[0] != 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e8,"gl_SamplePosition is not within interval [0,1]",
                           (allocator<char> *)local_a8);
                pTVar5 = local_c0;
                tcu::TestStatus::fail(local_c0,(string *)&local_e8);
LAB_00516a49:
                std::__cxx11::string::~string((string *)&local_e8);
                goto LAB_00516a53;
              }
              tcu::ConstPixelBufferAccess::getPixelUint
                        (&local_e8,
                         (int)(dataPerSample->
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              )._M_impl.super__Vector_impl_data._M_start + iVar11,uVar10,uVar8);
              local_68 = local_e8.m_format;
              tcu::ConstPixelBufferAccess::getPixelUint
                        ((ConstPixelBufferAccess *)local_a8,
                         (int)(dataPerSample->
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              )._M_impl.super__Vector_impl_data._M_start + iVar11,uVar10,uVar8);
              auVar19._0_8_ = (ulong)local_68 & 0xffffffff;
              auVar19._8_4_ = local_a8._4_4_;
              auVar19._12_4_ = 0;
              auVar15._0_4_ = (float)(SUB168(auVar19 | _DAT_0095eac0,0) - (double)DAT_0095eac0);
              auVar15._4_4_ = (float)(SUB168(auVar19 | _DAT_0095eac0,8) - DAT_0095eac0._8_8_);
              auVar15._8_8_ = 0;
              auVar15 = divps(auVar15,_DAT_009812c0);
              *(long *)(CONCAT44(distanceFromCenter.m_data[1],distanceFromCenter.m_data[0]) +
                       uVar9 * 8) = auVar15._0_8_;
              iVar11 = iVar11 + 0x28;
            }
            lVar2 = CONCAT44(distanceFromCenter.m_data[1],distanceFromCenter.m_data[0]);
            uVar4 = 1;
            uVar9 = 0;
            while (uVar9 != local_b8) {
              for (uVar7 = (ulong)uVar4; uVar7 < local_b8; uVar7 = uVar7 + 1) {
                fVar13 = *(float *)(lVar2 + uVar9 * 8);
                pfVar1 = (float *)(lVar2 + uVar7 * 8);
                if ((fVar13 == *pfVar1) && (!NAN(fVar13) && !NAN(*pfVar1))) {
                  fVar13 = *(float *)(lVar2 + 4 + uVar9 * 8);
                  pfVar1 = (float *)(lVar2 + 4 + uVar7 * 8);
                  if ((fVar13 == *pfVar1) && (!NAN(fVar13) && !NAN(*pfVar1))) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_e8,"Two samples have the same position",
                               (allocator<char> *)local_a8);
                    pTVar5 = local_c0;
                    tcu::TestStatus::fail(local_c0,(string *)&local_e8);
                    goto LAB_00516a49;
                  }
                }
              }
              uVar4 = uVar4 + 1;
              uVar9 = uVar9 + 1;
            }
            if (3 < (uint)local_b8) {
              auVar16 = ZEXT816(0);
              for (uVar9 = 0; local_b8 != uVar9; uVar9 = uVar9 + 1) {
                fVar13 = auVar16._0_4_;
                fVar17 = auVar16._4_4_;
                auVar16._4_4_ = fVar17 + *(float *)(lVar2 + 4 + uVar9 * 8);
                auVar16._0_4_ = *(float *)(lVar2 + uVar9 * 8) + fVar13;
                auVar16._8_4_ = 0;
                auVar16._12_4_ = fVar17;
              }
              auVar3._4_4_ = fStack_54;
              auVar3._0_4_ = local_58;
              auVar3._8_4_ = fStack_50;
              auVar3._12_4_ = fStack_4c;
              auVar15 = divps(auVar16,auVar3);
              local_a8._0_8_ = auVar15._0_8_;
              local_70.m_data[0] = 0.5;
              local_70.m_data[1] = 0.5;
              tcu::operator-((Vector<float,_2> *)local_a8,&local_70);
              tcu::abs<float,2>((Vector<float,_2> *)&local_e8);
              if ((fVar12 < distanceFromCenter_1.m_data[0]) ||
                 (fVar12 < distanceFromCenter_1.m_data[1])) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e8,
                           "Sample positions are not uniformly distributed within the pixel",
                           (allocator<char> *)&local_70);
                tcu::TestStatus::fail(local_c0,(string *)&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                pTVar5 = local_c0;
LAB_00516a53:
                std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                ~_Vector_base((_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               *)&distanceFromCenter);
                return pTVar5;
              }
            }
            std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
            ~_Vector_base((_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           *)&distanceFromCenter);
            uVar10 = uVar10 + 1;
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Passed",(allocator<char> *)&distanceFromCenter);
      pTVar5 = local_c0;
      tcu::TestStatus::pass(local_c0,(string *)&local_e8);
LAB_00516796:
      std::__cxx11::string::~string((string *)&local_e8);
      return pTVar5;
    }
    for (uVar8 = 0; uVar8 < (imageRSInfo->extent).height; uVar8 = uVar8 + 1) {
      for (uVar10 = 0; uVar10 < (imageRSInfo->extent).width; uVar10 = uVar10 + 1) {
        tcu::ConstPixelBufferAccess::getPixelUint(&local_e8,local_68.order,uVar10,uVar8);
        if (local_e8.m_size.m_data[0] != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"gl_SamplePosition is not within interval [0,1]",
                     (allocator<char> *)&distanceFromCenter);
          pTVar5 = local_c0;
          tcu::TestStatus::fail(local_c0,(string *)&local_e8);
          goto LAB_00516796;
        }
        if (3 < (uint)local_b8) {
          x = local_68.order;
          tcu::ConstPixelBufferAccess::getPixelUint(&local_e8,x,uVar10,uVar8);
          local_48 = local_e8.m_format;
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&distanceFromCenter,x,uVar10,uVar8);
          auVar18._0_8_ = (ulong)local_48 & 0xffffffff;
          auVar18._8_4_ = distanceFromCenter.m_data[1];
          auVar18._12_4_ = 0;
          auVar14._0_4_ = (float)(SUB168(auVar18 | _DAT_0095eac0,0) - (double)DAT_0095eac0);
          auVar14._4_4_ = (float)(SUB168(auVar18 | _DAT_0095eac0,8) - DAT_0095eac0._8_8_);
          auVar14._8_8_ = 0;
          auVar15 = divps(auVar14,_DAT_009812c0);
          local_a8._0_8_ = auVar15._0_8_;
          distanceFromCenter_1.m_data[0] = 0.5;
          distanceFromCenter_1.m_data[1] = 0.5;
          tcu::operator-((Vector<float,_2> *)local_a8,&distanceFromCenter_1);
          tcu::abs<float,2>((Vector<float,_2> *)&local_e8);
          if ((fVar12 < distanceFromCenter.m_data[0]) || (fVar12 < distanceFromCenter.m_data[1])) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,
                       "Sample positions are not uniformly distributed within the pixel",
                       (allocator<char> *)&distanceFromCenter_1);
            pTVar5 = local_c0;
            tcu::TestStatus::fail(local_c0,(string *)&local_e8);
            goto LAB_00516796;
          }
        }
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSamplePosDistribution>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																						 const vk::VkImageCreateInfo&						imageRSInfo,
																						 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																						 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	// approximate Bates distribution as normal
	const float variance = (1.0f / (12.0f * (float)numSamples));
	const float standardDeviation = deFloatSqrt(variance);

	// 95% of means of sample positions are within 2 standard deviations if
	// they were randomly assigned. Sample patterns are expected to be more
	// uniform than a random pattern.
	const float distanceThreshold = 2.0f * standardDeviation;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z).z();

		if (errorComponent > 0)
			return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			const tcu::Vec2 averageSamplePos	= tcu::Vec2((float)dataRS.getPixelUint(x, y, z).x() / 255.0f, (float)dataRS.getPixelUint(x, y, z).y() / 255.0f);
			const tcu::Vec2	distanceFromCenter	= tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		std::vector<tcu::Vec2> samplePositions(numSamples);

		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 errorComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z).z();

			if (errorComponent > 0)
				return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

			samplePositions[sampleNdx] = tcu::Vec2( (float)dataPerSample[sampleNdx].getPixelUint(x, y, z).x() / 255.0f,
													(float)dataPerSample[sampleNdx].getPixelUint(x, y, z).y() / 255.0f);
		}

		for (deUint32 sampleNdxA = 0u;				sampleNdxA < numSamples; ++sampleNdxA)
		for (deUint32 sampleNdxB = sampleNdxA + 1u; sampleNdxB < numSamples; ++sampleNdxB)
		{
			if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				return tcu::TestStatus::fail("Two samples have the same position");
		}

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			tcu::Vec2 averageSamplePos(0.0f, 0.0f);

			for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
			{
				averageSamplePos.x() += samplePositions[sampleNdx].x();
				averageSamplePos.y() += samplePositions[sampleNdx].y();
			}

			averageSamplePos.x() /= (float)numSamples;
			averageSamplePos.y() /= (float)numSamples;

			const tcu::Vec2	distanceFromCenter = tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	return tcu::TestStatus::pass("Passed");
}